

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_reduce(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int special)

{
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue obj_00;
  JSValue obj_01;
  JSValue obj_02;
  JSValue obj_03;
  JSValue func_obj;
  JSValue v_07;
  JSValue v_08;
  JSValue JVar1;
  int iVar2;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  long in_R8;
  uint in_R9D;
  JSValue JVar3;
  int present;
  int64_t k1;
  int64_t k;
  int64_t len;
  JSValue func;
  JSValue args [4];
  JSValue acc1;
  JSValue acc;
  JSValue index_val;
  JSValue val;
  JSValue obj;
  JSValue v;
  JSContext *in_stack_fffffffffffffdc0;
  JSValueUnion in_stack_fffffffffffffdc8;
  JSValueUnion JVar4;
  JSValueUnion in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  JSContext *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  int64_t in_stack_fffffffffffffdf0;
  JSValue in_stack_fffffffffffffdf8;
  JSValueUnion in_stack_fffffffffffffe08;
  JSValue *in_stack_fffffffffffffe10;
  JSValue in_stack_fffffffffffffe18;
  JSValue in_stack_fffffffffffffe28;
  JSValueUnion local_1b8;
  JSValue in_stack_fffffffffffffe58;
  uint uStack_174;
  JSValueUnion local_158;
  long local_150;
  JSValueUnion local_e0;
  int64_t local_d8;
  int32_t local_70;
  undefined4 uStack_6c;
  int64_t local_68;
  JSValueUnion local_60;
  JSValue *local_58;
  JSValueUnion local_30;
  JSValue *local_28;
  undefined4 uStack_c;
  
  local_e0.ptr = (void *)((ulong)uStack_174 << 0x20);
  local_d8 = 3;
  if ((in_R9D & 8) == 0) {
    JS_ToObject((JSContext *)local_1b8,in_stack_fffffffffffffe58);
    JVar3.u._4_4_ = in_stack_fffffffffffffdec;
    JVar3.u.int32 = in_stack_fffffffffffffde8;
    JVar3.tag = in_stack_fffffffffffffdf0;
    iVar2 = js_get_length64(in_stack_fffffffffffffde0,
                            (int64_t *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                            ,JVar3);
    local_30 = in_stack_fffffffffffffe08;
    local_28 = in_stack_fffffffffffffe10;
    if (iVar2 == 0) goto LAB_001ae4ab;
  }
  else {
    v_08.tag = in_RDX;
    v_08.u.float64 = in_RSI.float64;
    JS_DupValue(in_RDI,v_08);
    obj_00.tag._0_4_ = in_stack_fffffffffffffdd8;
    obj_00.u.ptr = in_stack_fffffffffffffdd0.ptr;
    obj_00.tag._4_4_ = in_stack_fffffffffffffddc;
    iVar2 = js_typed_array_get_length_internal((JSContext *)in_stack_fffffffffffffdc8.ptr,obj_00);
    local_150 = (long)iVar2;
    local_30 = in_stack_fffffffffffffe08;
    local_28 = in_stack_fffffffffffffe10;
    if (-1 < local_150) {
LAB_001ae4ab:
      obj_01.tag._0_4_ = in_stack_fffffffffffffdd8;
      obj_01.u.ptr = in_stack_fffffffffffffdd0.ptr;
      obj_01.tag._4_4_ = in_stack_fffffffffffffddc;
      iVar2 = check_function((JSContext *)in_stack_fffffffffffffdc8.ptr,obj_01);
      if (iVar2 == 0) {
        local_158.float64 = 0.0;
        if (in_ECX < 2) {
          do {
            if (local_150 <= (long)local_158.ptr) {
              JS_ThrowTypeError(in_RDI,"empty array");
              goto LAB_001aeb49;
            }
            in_stack_fffffffffffffdd0 = local_158;
            if ((in_R9D & 1) != 0) {
              in_stack_fffffffffffffdd0.ptr = (void *)((local_150 - (long)local_158) + -1);
            }
            local_158.float64 = local_158.float64 + 1;
            if ((in_R9D & 8) != 0) {
              obj_02.tag = (int64_t)local_28;
              obj_02.u.ptr = local_30.ptr;
              in_stack_fffffffffffffe28 =
                   JS_GetPropertyInt64((JSContext *)in_stack_fffffffffffffdf8.tag,obj_02,
                                       (int64_t)in_stack_fffffffffffffdf8.u);
              local_e0 = in_stack_fffffffffffffe28.u;
              local_d8 = in_stack_fffffffffffffe28.tag;
              iVar2 = JS_IsException(in_stack_fffffffffffffe28);
              if (iVar2 != 0) goto LAB_001aeb49;
              break;
            }
            iVar2 = JS_TryGetPropertyInt64
                              ((JSContext *)in_stack_fffffffffffffe18.tag,in_stack_fffffffffffffe28,
                               (int64_t)in_stack_fffffffffffffe18.u,local_28);
            if (iVar2 < 0) goto LAB_001aeb49;
          } while (iVar2 == 0);
        }
        else {
          JVar3 = JS_DupValue(in_RDI,*(JSValue *)(in_R8 + 0x10));
          local_1b8 = JVar3.u;
          local_e0 = local_1b8;
          local_d8 = JVar3.tag;
        }
        do {
          if (local_150 <= (long)local_158.ptr) goto LAB_001aeb0a;
          JVar4 = local_158;
          if ((in_R9D & 1) != 0) {
            JVar4.ptr = (void *)((local_150 - (long)local_158) + -1);
          }
          in_stack_fffffffffffffdc8 = JVar4;
          if ((in_R9D & 8) == 0) {
            iVar2 = JS_TryGetPropertyInt64
                              ((JSContext *)in_stack_fffffffffffffe18.tag,in_stack_fffffffffffffe28,
                               (int64_t)in_stack_fffffffffffffe18.u,local_28);
            if (iVar2 < 0) break;
          }
          else {
            obj_03.tag = (int64_t)local_28;
            obj_03.u.float64 = local_30.float64;
            in_stack_fffffffffffffe18 =
                 JS_GetPropertyInt64((JSContext *)in_stack_fffffffffffffdf8.tag,obj_03,
                                     (int64_t)in_stack_fffffffffffffdf8.u);
            iVar2 = JS_IsException(in_stack_fffffffffffffe18);
            if (iVar2 != 0) break;
            iVar2 = 1;
          }
          if (iVar2 != 0) {
            if (JVar4.ptr == (void *)(long)JVar4.int32) {
              local_30._4_4_ = uStack_c;
              local_30.int32 = JVar4.int32;
              local_28 = (JSValue *)0x0;
            }
            else {
              JVar3 = __JS_NewFloat64(in_RDI,(double)JVar4.float64);
              local_60 = JVar3.u;
              local_30 = local_60;
              local_58 = (JSValue *)JVar3.tag;
              local_28 = local_58;
            }
            v_07.tag = (int64_t)local_28;
            v_07.u.ptr = local_30.ptr;
            iVar2 = JS_IsException(v_07);
            if (iVar2 != 0) break;
            func_obj.tag = (int64_t)local_28;
            func_obj.u.ptr = local_30.ptr;
            JVar3 = JS_Call((JSContext *)0x3,func_obj,in_stack_fffffffffffffdf8,
                            in_stack_fffffffffffffdec,(JSValue *)in_stack_fffffffffffffe28.tag);
            local_e0 = JVar3.u;
            local_d8 = JVar3.tag;
            v_00.tag = (int64_t)in_stack_fffffffffffffdd0.ptr;
            v_00.u.ptr = in_stack_fffffffffffffdc8.ptr;
            in_stack_fffffffffffffdf8 = JVar3;
            JS_FreeValue(in_stack_fffffffffffffdc0,v_00);
            v_01.tag = (int64_t)in_stack_fffffffffffffdd0.ptr;
            v_01.u.ptr = in_stack_fffffffffffffdc8.ptr;
            JS_FreeValue(in_stack_fffffffffffffdc0,v_01);
            iVar2 = JS_IsException(JVar3);
            if (iVar2 != 0) break;
            v_02.tag = (int64_t)in_stack_fffffffffffffdd0.ptr;
            v_02.u.ptr = in_stack_fffffffffffffdc8.ptr;
            JS_FreeValue(in_stack_fffffffffffffdc0,v_02);
          }
          local_158.float64 = local_158.float64 + 1;
        } while( true );
      }
    }
  }
LAB_001aeb49:
  v_04.tag = (int64_t)in_stack_fffffffffffffdd0.ptr;
  v_04.u.ptr = in_stack_fffffffffffffdc8.ptr;
  JS_FreeValue(in_stack_fffffffffffffdc0,v_04);
  v_05.tag = (int64_t)in_stack_fffffffffffffdd0.ptr;
  v_05.u.ptr = in_stack_fffffffffffffdc8.ptr;
  JS_FreeValue(in_stack_fffffffffffffdc0,v_05);
  v_06.tag = (int64_t)in_stack_fffffffffffffdd0.ptr;
  v_06.u.ptr = in_stack_fffffffffffffdc8.ptr;
  JS_FreeValue(in_stack_fffffffffffffdc0,v_06);
  local_70 = 0;
  local_68 = 6;
LAB_001aebb7:
  JVar1.u._4_4_ = uStack_6c;
  JVar1.u.int32 = local_70;
  JVar1.tag = local_68;
  return JVar1;
LAB_001aeb0a:
  v_03.tag = (int64_t)in_stack_fffffffffffffdd0.ptr;
  v_03.u.ptr = in_stack_fffffffffffffdc8.ptr;
  JS_FreeValue(in_stack_fffffffffffffdc0,v_03);
  local_70 = local_e0.int32;
  uStack_6c = local_e0._4_4_;
  local_68 = local_d8;
  goto LAB_001aebb7;
}

Assistant:

static JSValue js_array_reduce(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int special)
{
    JSValue obj, val, index_val, acc, acc1;
    JSValueConst args[4];
    JSValueConst func;
    int64_t len, k, k1;
    int present;

    acc = JS_UNDEFINED;
    val = JS_UNDEFINED;
    if (special & special_TA) {
        obj = JS_DupValue(ctx, this_val);
        len = js_typed_array_get_length_internal(ctx, obj);
        if (len < 0)
            goto exception;
    } else {
        obj = JS_ToObject(ctx, this_val);
        if (js_get_length64(ctx, &len, obj))
            goto exception;
    }
    func = argv[0];

    if (check_function(ctx, func))
        goto exception;

    k = 0;
    if (argc > 1) {
        acc = JS_DupValue(ctx, argv[1]);
    } else {
        for(;;) {
            if (k >= len) {
                JS_ThrowTypeError(ctx, "empty array");
                goto exception;
            }
            k1 = (special & special_reduceRight) ? len - k - 1 : k;
            k++;
            if (special & special_TA) {
                acc = JS_GetPropertyInt64(ctx, obj, k1);
                if (JS_IsException(acc))
                    goto exception;
                break;
            } else {
                present = JS_TryGetPropertyInt64(ctx, obj, k1, &acc);
                if (present < 0)
                    goto exception;
                if (present)
                    break;
            }
        }
    }
    for (; k < len; k++) {
        k1 = (special & special_reduceRight) ? len - k - 1 : k;
        if (special & special_TA) {
            val = JS_GetPropertyInt64(ctx, obj, k1);
            if (JS_IsException(val))
                goto exception;
            present = TRUE;
        } else {
            present = JS_TryGetPropertyInt64(ctx, obj, k1, &val);
            if (present < 0)
                goto exception;
        }
        if (present) {
            index_val = JS_NewInt64(ctx, k1);
            if (JS_IsException(index_val))
                goto exception;
            args[0] = acc;
            args[1] = val;
            args[2] = index_val;
            args[3] = obj;
            acc1 = JS_Call(ctx, func, JS_UNDEFINED, 4, args);
            JS_FreeValue(ctx, index_val);
            JS_FreeValue(ctx, val);
            val = JS_UNDEFINED;
            if (JS_IsException(acc1))
                goto exception;
            JS_FreeValue(ctx, acc);
            acc = acc1;
        }
    }
    JS_FreeValue(ctx, obj);
    return acc;

exception:
    JS_FreeValue(ctx, acc);
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}